

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O0

ssize_t nettlp_pcie_cfg_write(nettlp_pcie_cfg *ntpc,uint16_t addr,void *buf,size_t count)

{
  int iVar1;
  uint16_t dwaddr_00;
  ushort uVar2;
  uint data_00;
  long in_RCX;
  void *in_RDX;
  ushort in_SI;
  int lstpad;
  int fstpad;
  uint16_t end_dwaddr;
  uint16_t start_dwaddr;
  int written;
  int len;
  uint8_t *ptr;
  uint32_t data;
  uint8_t mask;
  uint16_t dwaddr;
  int ret;
  int local_54;
  int iVar3;
  int iVar4;
  undefined4 *local_40;
  undefined4 local_34;
  byte local_2f;
  ushort local_2e;
  int local_2c;
  void *local_20;
  long local_8;
  
  iVar3 = 0;
  data_00 = in_SI & 3;
  local_54 = 4 - ((uint)in_SI + (int)in_RCX & 3);
  dwaddr_00 = (uint16_t)((int)(uint)in_SI >> 2);
  uVar2 = (ushort)((ulong)in_SI + in_RCX >> 2);
  local_2e = dwaddr_00;
  local_20 = in_RDX;
  if (local_54 == 4) {
    local_54 = 0;
    uVar2 = uVar2 - 1;
  }
  for (; iVar1 = iVar3, local_2e <= uVar2; local_2e = local_2e + 1) {
    iVar4 = 4;
    local_2f = 0xf;
    local_34 = 0;
    local_40 = &local_34;
    if ((local_2e == dwaddr_00) && (data_00 != 0)) {
      local_2f = (byte)(0xf << ((byte)data_00 & 0x1f)) & 0xf;
      iVar4 = 4 - data_00;
      local_40 = (undefined4 *)((long)local_40 + (long)(int)data_00);
    }
    if ((local_2e == uVar2) && (local_54 != 0)) {
      local_2f = local_2f & (byte)(0xf >> ((byte)local_54 & 0x1f)) & 0xf;
      iVar4 = iVar4 - local_54;
    }
    memcpy(local_40,local_20,(long)iVar4);
    local_2c = pcie_cfg_write_dw((nettlp_pcie_cfg *)CONCAT44(iVar4,iVar3),dwaddr_00,
                                 (uint8_t)(uVar2 >> 8),data_00);
    iVar1 = local_2c;
    if (local_2c < 0) break;
    local_20 = (void *)((long)local_20 + (long)iVar4);
    iVar3 = iVar4 + iVar3;
  }
  local_8 = (long)iVar1;
  return local_8;
}

Assistant:

ssize_t nettlp_pcie_cfg_write(struct nettlp_pcie_cfg *ntpc, uint16_t addr,
			      void *buf, size_t count)
{
	int ret;
	uint16_t dwaddr;
	uint8_t mask;
	uint32_t data;
	uint8_t *ptr;

	int len, written = 0;
	uint16_t start_dwaddr, end_dwaddr;
	int fstpad;	/* unnecessary bytes in first DWORD */
	int lstpad;	/* unnecessary bytes in last DWORD */

	fstpad = addr & 0x0003;
	lstpad = 4 - ((addr + count) & 0x0003);

	start_dwaddr = addr >> 2;
	end_dwaddr = (addr + count) >> 2;
	if (lstpad == 4) {
		lstpad = 0;
		end_dwaddr--;
	}

	for (dwaddr = start_dwaddr; dwaddr <= end_dwaddr; dwaddr++) {
		len = 4;
		mask = 0xF;
		data = 0;
		ptr = (uint8_t *)&data;
		if (dwaddr == start_dwaddr && fstpad) {
			mask &= ((0x0F << fstpad) & 0x0F);
			len -= fstpad;
			ptr += fstpad;
		}
		if (dwaddr == end_dwaddr && lstpad) {
			mask &= ((0x0F >> lstpad) & 0x0F);
			len -= lstpad;
		}

		memcpy(ptr, buf, len);

		ret = pcie_cfg_write_dw(ntpc, dwaddr, mask, data);
		if (ret < 0)
			return ret;

		buf += len;
		written += len;
	}

	return written;
}